

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isLookupResultValid
               (Texture2DView *texture,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  FilterMode FVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  float __x;
  float fVar11;
  float __x_00;
  undefined1 auVar12 [16];
  Vec2 local_38;
  
  __x = (float)*(undefined8 *)lodBounds->m_data;
  __x_00 = (float)((ulong)*(undefined8 *)lodBounds->m_data >> 0x20);
  fVar11 = sampler->lodThreshold;
  if (__x <= fVar11) {
    bVar1 = isLevelSampleResultValid
                      (texture->m_levels,sampler,sampler->magFilter,prec,coord,0,result);
    uVar3 = (uint)bVar1;
    if ((bVar1) || (__x_00 <= fVar11)) goto LAB_00a8db07;
LAB_00a8d91b:
    FVar6 = sampler->minFilter;
    iVar7 = texture->m_numLevels;
    uVar10 = iVar7 - 1;
    if ((int)uVar10 < 1 || (FVar6 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
      if ((FVar6 == LINEAR_MIPMAP_NEAREST) || (FVar6 == NEAREST_MIPMAP_NEAREST)) {
        fVar11 = ceilf(__x + 0.5);
        uVar4 = (int)fVar11 - 1;
        uVar8 = uVar10;
        if ((int)uVar4 < (int)uVar10) {
          uVar8 = uVar4;
        }
        uVar3 = 0;
        if ((int)uVar4 < 0) {
          uVar8 = uVar3;
        }
        fVar11 = floorf(__x_00 + 0.5);
        uVar4 = (uint)fVar11;
        if ((int)uVar4 < (int)uVar10) {
          uVar10 = uVar4;
        }
        if ((int)uVar4 < 0) {
          uVar10 = 0;
        }
        if ((int)uVar10 < (int)uVar8) goto LAB_00a8db07;
        do {
          uVar3 = sampler->minFilter - LINEAR;
          FVar6 = NEAREST;
          if (uVar3 < 5) {
            FVar6 = *(FilterMode *)(&DAT_00b96960 + (ulong)uVar3 * 4);
          }
          bVar1 = isLevelSampleResultValid
                            (texture->m_levels + (int)uVar8,sampler,FVar6,prec,coord,0,result);
          if (bVar1) goto LAB_00a8db04;
          uVar8 = uVar8 + 1;
        } while ((int)uVar8 <= (int)uVar10);
        goto LAB_00a8d8cc;
      }
      uVar3 = 0;
      bVar1 = isLevelSampleResultValid(texture->m_levels,sampler,FVar6,prec,coord,0,result);
      if (!bVar1) goto LAB_00a8db07;
    }
    else {
      fVar11 = floorf(__x);
      iVar2 = (int)fVar11;
      iVar7 = iVar7 + -2;
      iVar9 = iVar7;
      if (iVar2 < iVar7) {
        iVar9 = iVar2;
      }
      if (iVar2 < 0) {
        iVar9 = 0;
      }
      fVar11 = floorf(__x_00);
      iVar2 = (int)fVar11;
      if (iVar2 < iVar7) {
        iVar7 = iVar2;
      }
      if (iVar2 < 0) {
        iVar7 = 0;
      }
      do {
        uVar3 = 0;
        FVar6 = NEAREST;
        if (iVar7 < iVar9) goto LAB_00a8db07;
        uVar3 = sampler->minFilter - LINEAR;
        if (uVar3 < 5) {
          FVar6 = *(FilterMode *)(&DAT_00b96960 + (ulong)uVar3 * 4);
        }
        fVar11 = (float)iVar9;
        auVar12._4_4_ = __x_00 - fVar11;
        auVar12._0_4_ = __x - fVar11;
        auVar12._8_4_ = 0.0 - fVar11;
        auVar12._12_4_ = 0.0 - fVar11;
        auVar12 = minps(_DAT_00ad7f10,auVar12);
        lVar5 = (long)iVar9;
        iVar9 = iVar9 + 1;
        local_38.m_data[1] = (float)(-(uint)(0.0 <= __x_00 - fVar11) & auVar12._4_4_);
        local_38.m_data[0] = (float)(-(uint)(0.0 <= __x - fVar11) & auVar12._0_4_);
        bVar1 = isMipmapLinearSampleResultValid
                          (texture->m_levels + lVar5,texture->m_levels + iVar9,sampler,FVar6,prec,
                           coord,0,&local_38,result);
      } while (!bVar1);
    }
LAB_00a8db04:
    uVar3 = 1;
  }
  else {
    if (fVar11 < __x_00) goto LAB_00a8d91b;
LAB_00a8d8cc:
    uVar3 = 0;
  }
LAB_00a8db07:
  return SUB41(uVar3,0);
}

Assistant:

bool isLookupResultValid (const Texture2DView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec2& coord, const Vec2& lodBounds, const Vec4& result)
{
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	if (canBeMagnified)
	{
		if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coord, 0, result))
			return true;
	}

	if (canBeMinified)
	{
		const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
		const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
		const int	minTexLevel		= 0;
		const int	maxTexLevel		= texture.getNumLevels()-1;

		DE_ASSERT(minTexLevel <= maxTexLevel);

		if (isLinearMipmap && minTexLevel < maxTexLevel)
		{
			const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
				const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

				if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coord, 0, Vec2(minF, maxF), result))
					return true;
			}
		}
		else if (isNearestMipmap)
		{
			// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
			//		 decision to allow floor(lod + 0.5) as well.
			const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coord, 0, result))
					return true;
			}
		}
		else
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coord, 0, result))
				return true;
		}
	}

	return false;
}